

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O2

void duckdb_result_arrow_array
               (duckdb_result result,duckdb_data_chunk chunk,duckdb_arrow_array *out_array)

{
  ArrowArray *out_array_00;
  pointer pQVar1;
  ClientContext *context;
  ClientProperties CStack_88;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  if (out_array != (duckdb_arrow_array *)0x0) {
    pQVar1 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result.internal_data);
    context = duckdb::optional_ptr<duckdb::ClientContext,_true>::operator*
                        (&(pQVar1->client_properties).client_context);
    pQVar1 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result.internal_data);
    duckdb::ArrowTypeExtensionData::GetExtensionTypes
              ((unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                *)&local_58,context,&(pQVar1->super_BaseQueryResult).types);
    out_array_00 = (ArrowArray *)*out_array;
    pQVar1 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result.internal_data);
    duckdb::ClientProperties::ClientProperties(&CStack_88,&pQVar1->client_properties);
    duckdb::ArrowConverter::ToArrowArray
              ((DataChunk *)chunk,out_array_00,&CStack_88,
               (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                *)&local_58);
    std::__cxx11::string::~string((string *)&CStack_88);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_58);
  }
  return;
}

Assistant:

void duckdb_result_arrow_array(duckdb_result result, duckdb_data_chunk chunk, duckdb_arrow_array *out_array) {
	if (!out_array) {
		return;
	}
	auto dchunk = reinterpret_cast<duckdb::DataChunk *>(chunk);
	auto &result_data = *(reinterpret_cast<duckdb::DuckDBResultData *>(result.internal_data));
	auto extension_type_cast = duckdb::ArrowTypeExtensionData::GetExtensionTypes(
	    *result_data.result->client_properties.client_context, result_data.result->types);

	ArrowConverter::ToArrowArray(*dchunk, reinterpret_cast<ArrowArray *>(*out_array),
	                             result_data.result->client_properties, extension_type_cast);
}